

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_bind(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue obj;
  JSValue val_00;
  JSValue val_01;
  JSValue str2;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue val_02;
  JSValue v_03;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue obj_00;
  JSValue obj_01;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSAtom in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar6;
  JSValue JVar7;
  double d;
  int len1;
  int ret;
  int i;
  int arg_count;
  JSObject *p;
  JSValue len_val;
  JSValue name1;
  JSValue func_obj;
  JSBoundFunction *bf;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValue v;
  JSAtom in_stack_fffffffffffffd6c;
  JSContext *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  JSClassID in_stack_fffffffffffffd7c;
  JSValueUnion in_stack_fffffffffffffd80;
  JSValueUnion in_stack_fffffffffffffd88;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffdb0;
  JSAtom JVar8;
  JSContext *in_stack_fffffffffffffdb8;
  JSValueUnion in_stack_fffffffffffffdc0;
  JSValueUnion in_stack_fffffffffffffdc8;
  JSValueUnion in_stack_fffffffffffffdd0;
  int64_t in_stack_fffffffffffffdd8;
  double local_220;
  int flags;
  undefined8 in_stack_fffffffffffffdf0;
  JSValueUnion local_1e0;
  int64_t local_1d8;
  JSValueUnion local_1d0;
  int64_t local_1c8;
  JSValueUnion local_1c0;
  int64_t local_1b8;
  JSValueUnion local_1b0;
  int64_t local_1a8;
  int local_198;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffedc;
  int64_t in_stack_fffffffffffffee0;
  JSValueUnion local_f8;
  JSContext *local_f0;
  JSValueUnion local_c8;
  uint uStack_a4;
  BOOL throw_ref_error;
  undefined8 in_stack_ffffffffffffff60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 uStack_44;
  int64_t local_8;
  
  JVar6.tag = (int64_t)in_stack_fffffffffffffd88.ptr;
  JVar6.u.ptr = in_stack_fffffffffffffd80.ptr;
  iVar2 = check_function((JSContext *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         JVar6);
  if (iVar2 != 0) {
    uVar9 = 0;
    local_1a8 = 6;
    goto LAB_001ac3ca;
  }
  JVar7.tag = (int64_t)in_stack_fffffffffffffd90.ptr;
  JVar7.u.ptr = in_stack_fffffffffffffd88.ptr;
  JVar6 = JS_NewObjectProtoClass
                    ((JSContext *)in_stack_fffffffffffffd80.ptr,JVar7,in_stack_fffffffffffffd7c);
  local_1b0 = JVar6.u;
  local_1a8 = JVar6.tag;
  iVar2 = JS_IsException(JVar6);
  if (iVar2 != 0) {
    uVar9 = 0;
    local_1a8 = 6;
    goto LAB_001ac3ca;
  }
  val_02.tag = in_RDX;
  val_02.u.ptr = in_RSI.ptr;
  iVar2 = JS_IsConstructor(in_RDI,val_02);
  *(byte *)((long)local_1b0.ptr + 5) =
       *(byte *)((long)local_1b0.ptr + 5) & 0xef | ((byte)iVar2 & 1) << 4;
  iVar2 = max_int(0,in_ECX - 1);
  JVar4.float64 =
       (double)js_malloc(in_stack_fffffffffffffd88.float64,in_stack_fffffffffffffd80.float64);
  JVar5._4_4_ = in_stack_fffffffffffffd7c;
  JVar5.int32 = in_stack_fffffffffffffd78;
  if (JVar4.ptr != (void *)0x0) {
    v_03.tag = in_RDX;
    v_03.u.ptr = in_RSI.ptr;
    in_stack_fffffffffffffd80.ptr = JVar4.ptr;
    JVar7 = JS_DupValue(in_RDI,v_03);
    local_1c0 = JVar7.u;
    *(JSValueUnion *)in_stack_fffffffffffffd80.ptr = local_1c0;
    local_1b8 = JVar7.tag;
    *(int64_t *)((long)in_stack_fffffffffffffd80.ptr + 8) = local_1b8;
    ctx_00.ptr = JVar4.ptr;
    JVar7 = JS_DupValue(in_RDI,*in_R8);
    JVar5._4_4_ = in_stack_fffffffffffffd7c;
    JVar5.int32 = in_stack_fffffffffffffd78;
    local_1d0 = JVar7.u;
    *(JSValueUnion *)((long)ctx_00.ptr + 0x10) = local_1d0;
    local_1c8 = JVar7.tag;
    *(int64_t *)((long)ctx_00.ptr + 0x18) = local_1c8;
    *(int *)((long)JVar4.ptr + 0x20) = iVar2;
    local_198 = 0;
    local_58 = in_stack_fffffffffffffdd0;
    local_8 = in_stack_fffffffffffffdd8;
    while( true ) {
      flags = (int)in_stack_fffffffffffffdf0;
      throw_ref_error = (BOOL)in_stack_ffffffffffffff60;
      JVar8 = (JSAtom)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      if (iVar2 <= local_198) break;
      JVar5.ptr = (void *)((long)JVar4.ptr + (long)local_198 * 0x10 + 0x28);
      JVar7 = JS_DupValue(in_RDI,in_R8[local_198 + 1]);
      local_1e0 = JVar7.u;
      *(JSValueUnion *)JVar5.ptr = local_1e0;
      local_1d8 = JVar7.tag;
      *(int64_t *)((long)JVar5.ptr + 8) = local_1d8;
      local_198 = local_198 + 1;
    }
    ((JSValueUnion *)((long)local_1b0.ptr + 0x30))->ptr = (void *)JVar4;
    obj.tag = in_stack_fffffffffffffd98;
    obj.u.float64 = in_stack_fffffffffffffd90.float64;
    iVar3 = JS_GetOwnProperty((JSContext *)ctx_00.ptr,
                              (JSPropertyDescriptor *)in_stack_fffffffffffffd80.ptr,obj,JVar5._4_4_)
    ;
    if (-1 < iVar3) {
      if (iVar3 != 0) {
        obj_00.u._4_4_ = in_stack_fffffffffffffedc;
        obj_00.u.int32 = in_stack_fffffffffffffed8;
        obj_00.tag = in_stack_fffffffffffffee0;
        this_obj_01.tag = in_RDX;
        this_obj_01.u.ptr = in_RSI.ptr;
        JVar7 = JS_GetPropertyInternal(in_RDI,obj_00,in_ECX,this_obj_01,throw_ref_error);
        local_c8 = JVar7.u;
        iVar3 = JS_IsException(JVar7);
        if (iVar3 != 0) goto LAB_001ac396;
        if ((int)JVar7.tag == 0) {
          flags = 0;
        }
        else if ((int)JVar7.tag == 7) {
          if (NAN(local_c8.float64)) {
            local_220 = 0.0;
          }
          else {
            local_220 = trunc(local_c8.float64);
            if ((double)iVar2 < local_220) {
              local_220 = local_220 - (double)iVar2;
            }
            else {
              local_220 = 0.0;
            }
          }
          if (local_220 == (double)(int)local_220) {
            local_58._4_4_ = uStack_44;
            local_58.int32 = (int)local_220;
            local_8 = 0;
          }
          else {
            JVar7 = __JS_NewFloat64(in_RDI,local_220);
            local_58 = JVar7.u;
            local_50 = JVar7.tag;
            local_8 = local_50;
          }
        }
        else {
          v_00.tag = (int64_t)in_stack_fffffffffffffd80.ptr;
          v_00.u.float64 = JVar5.float64;
          JS_FreeValue(in_stack_fffffffffffffd70,v_00);
          throw_ref_error = 0;
          in_stack_fffffffffffffdc0.ptr = (void *)((ulong)uStack_a4 << 0x20);
          in_stack_fffffffffffffdc8.float64 = 0.0;
        }
      }
      this_obj.tag = local_8;
      this_obj.u.float64 = local_58.float64;
      val_00.tag = (int64_t)in_stack_fffffffffffffdc8.ptr;
      val_00.u.float64 = in_stack_fffffffffffffdc0.float64;
      JS_DefinePropertyValue(in_stack_fffffffffffffdb8,this_obj,JVar8,val_00,flags);
      obj_01.u._4_4_ = in_stack_fffffffffffffedc;
      obj_01.u.int32 = in_stack_fffffffffffffed8;
      obj_01.tag = in_stack_fffffffffffffee0;
      this_obj_02.tag = in_RDX;
      this_obj_02.u.float64 = in_RSI.float64;
      JVar7 = JS_GetPropertyInternal(in_RDI,obj_01,in_ECX,this_obj_02,throw_ref_error);
      local_f8 = JVar7.u;
      local_f0 = (JSContext *)JVar7.tag;
      iVar2 = JS_IsException(JVar7);
      if (iVar2 == 0) {
        iVar2 = JS_IsString(JVar7);
        if (iVar2 == 0) {
          v_01.tag = (int64_t)in_stack_fffffffffffffd80.ptr;
          v_01.u.ptr = JVar5.ptr;
          JS_FreeValue(in_stack_fffffffffffffd70,v_01);
          JS_AtomToString(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
        }
        str2.tag = (int64_t)local_58.ptr;
        str2.u.ptr = in_stack_fffffffffffffdc8.ptr;
        JVar7 = JS_ConcatString3((JSContext *)in_stack_fffffffffffffdc0.ptr,(char *)local_f0,str2,
                                 (char *)local_f8.ptr);
        JVar8 = local_f8._4_4_;
        iVar2 = JS_IsException(JVar7);
        if (iVar2 == 0) {
          this_obj_00.tag = local_8;
          this_obj_00.u.ptr = local_58.ptr;
          val_01.tag = (int64_t)in_stack_fffffffffffffdc8.ptr;
          val_01.u.ptr = in_stack_fffffffffffffdc0.ptr;
          JS_DefinePropertyValue(local_f0,this_obj_00,JVar8,val_01,flags);
          uVar9 = JVar6.u._0_4_;
          in_stack_fffffffffffffedc = JVar6.u._4_4_;
          goto LAB_001ac3ca;
        }
      }
    }
  }
LAB_001ac396:
  v_02.tag = (int64_t)in_stack_fffffffffffffd80.ptr;
  v_02.u.float64 = JVar5.float64;
  JS_FreeValue(in_stack_fffffffffffffd70,v_02);
  uVar9 = 0;
  local_1a8 = 6;
LAB_001ac3ca:
  JVar1.u._4_4_ = in_stack_fffffffffffffedc;
  JVar1.u.int32 = uVar9;
  JVar1.tag = local_1a8;
  return JVar1;
}

Assistant:

static JSValue js_function_bind(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSBoundFunction *bf;
    JSValue func_obj, name1, len_val;
    JSObject *p;
    int arg_count, i, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                 JS_CLASS_BOUND_FUNCTION);
    if (JS_IsException(func_obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(func_obj);
    p->is_constructor = JS_IsConstructor(ctx, this_val);
    arg_count = max_int(0, argc - 1);
    bf = js_malloc(ctx, sizeof(*bf) + arg_count * sizeof(JSValue));
    if (!bf)
        goto exception;
    bf->func_obj = JS_DupValue(ctx, this_val);
    bf->this_val = JS_DupValue(ctx, argv[0]);
    bf->argc = arg_count;
    for(i = 0; i < arg_count; i++) {
        bf->argv[i] = JS_DupValue(ctx, argv[i + 1]);
    }
    p->u.bound_function = bf;

    /* XXX: the spec could be simpler by only using GetOwnProperty */
    ret = JS_GetOwnProperty(ctx, NULL, this_val, JS_ATOM_length);
    if (ret < 0)
        goto exception;
    if (!ret) {
        len_val = JS_NewInt32(ctx, 0);
    } else {
        len_val = JS_GetProperty(ctx, this_val, JS_ATOM_length);
        if (JS_IsException(len_val))
            goto exception;
        if (JS_VALUE_GET_TAG(len_val) == JS_TAG_INT) {
            /* most common case */
            int len1 = JS_VALUE_GET_INT(len_val);
            if (len1 <= arg_count)
                len1 = 0;
            else
                len1 -= arg_count;
            len_val = JS_NewInt32(ctx, len1);
        } else if (JS_VALUE_GET_NORM_TAG(len_val) == JS_TAG_FLOAT64) {
            double d = JS_VALUE_GET_FLOAT64(len_val);
            if (isnan(d)) {
                d = 0.0;
            } else {
                d = trunc(d);
                if (d <= (double)arg_count)
                    d = 0.0;
                else
                    d -= (double)arg_count; /* also converts -0 to +0 */
            }
            len_val = JS_NewFloat64(ctx, d);
        } else {
            JS_FreeValue(ctx, len_val);
            len_val = JS_NewInt32(ctx, 0);
        }
    }
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_length,
                           len_val, JS_PROP_CONFIGURABLE);

    name1 = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsException(name1))
        goto exception;
    if (!JS_IsString(name1)) {
        JS_FreeValue(ctx, name1);
        name1 = JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    name1 = JS_ConcatString3(ctx, "bound ", name1, "");
    if (JS_IsException(name1))
        goto exception;
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_name, name1,
                           JS_PROP_CONFIGURABLE);
    return func_obj;
 exception:
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}